

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsSecondPartialDerivativeWRTStateControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *lambda,MatrixDynSize *hessian)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  OptimalControlProblemPimpl *pOVar7;
  double dVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  Index size;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  PointerType pdVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  size_type sVar20;
  ostream *poVar21;
  long lVar22;
  _Base_ptr p_Var23;
  ulong uVar24;
  ostringstream errorMsg;
  bool local_205;
  string local_200;
  VectorDynSize *local_1e0;
  MatrixDynSize *local_1d8;
  VectorDynSize *local_1d0;
  long local_1c8;
  VectorDynSize *local_1c0;
  _Rb_tree_node_base *local_1b8;
  double local_1b0;
  MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  local_1a8 [4];
  ios_base local_138 [264];
  
  local_1b0 = time;
  lVar13 = iDynTree::MatrixDynSize::rows();
  local_1d0 = state;
  lVar14 = iDynTree::VectorDynSize::size();
  if (lVar13 == lVar14) {
    lVar13 = iDynTree::MatrixDynSize::cols();
    lVar14 = iDynTree::VectorDynSize::size();
    if (lVar13 == lVar14) goto LAB_00149ef4;
  }
  uVar15 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)hessian,uVar15);
LAB_00149ef4:
  pOVar7 = this->m_pimpl;
  local_1e0 = control;
  if ((pOVar7->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iDynTree::MatrixDynSize::zero();
    local_205 = true;
  }
  else {
    p_Var23 = (pOVar7->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1b8 = &(pOVar7->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_205 = p_Var23 == local_1b8;
    if (!local_205) {
      bVar10 = true;
      local_1c8 = 0;
      local_1d8 = hessian;
      local_1c0 = lambda;
      do {
        lVar13 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        ConstraintsGroup::constraintsDimension((ConstraintsGroup *)**(undefined8 **)(p_Var23 + 2));
        uVar16 = iDynTree::VectorDynSize::data();
        uVar17 = iDynTree::VectorDynSize::size();
        uVar15 = uVar17;
        if (((uVar16 & 7) == 0) &&
           (uVar15 = (ulong)((uint)(uVar16 >> 3) & 1), (long)uVar17 <= (long)uVar15)) {
          uVar15 = uVar17;
        }
        lVar13 = lVar13 + local_1c8 * 8;
        if (0 < (long)uVar15) {
          uVar24 = 0;
          do {
            *(undefined8 *)(uVar16 + uVar24 * 8) = *(undefined8 *)(lVar13 + uVar24 * 8);
            uVar24 = uVar24 + 1;
          } while (uVar15 != uVar24);
        }
        lVar14 = uVar17 - uVar15;
        uVar24 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar15;
        if (1 < lVar14) {
          do {
            puVar1 = (undefined8 *)(lVar13 + uVar15 * 8);
            uVar9 = puVar1[1];
            puVar2 = (undefined8 *)(uVar16 + uVar15 * 8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar9;
            uVar15 = uVar15 + 2;
          } while ((long)uVar15 < (long)uVar24);
        }
        if ((long)uVar24 < (long)uVar17) {
          do {
            *(undefined8 *)(uVar16 + uVar24 * 8) = *(undefined8 *)(lVar13 + uVar24 * 8);
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
        }
        puVar1 = *(undefined8 **)(p_Var23 + 2);
        bVar11 = ConstraintsGroup::constraintSecondPartialDerivativeWRTStateControl
                           ((ConstraintsGroup *)*puVar1,local_1b0,local_1d0,control,
                            (VectorDynSize *)(puVar1 + 0x1f),(MatrixDynSize *)(puVar1 + 0x1a));
        if (bVar11) {
          if (bVar10) {
            pdVar18 = (PointerType)iDynTree::MatrixDynSize::data();
            lVar13 = iDynTree::MatrixDynSize::rows();
            local_1a8[0].
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value = iDynTree::MatrixDynSize::cols();
            local_1a8[0].
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data = pdVar18;
            local_1a8[0].
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value = lVar13;
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)iDynTree::MatrixDynSize::data();
            sVar20 = iDynTree::MatrixDynSize::rows();
            local_200.field_2._M_allocated_capacity = iDynTree::MatrixDynSize::cols();
            local_200._M_dataplus._M_p = (pointer)paVar19;
            local_200._M_string_length = sVar20;
            Eigen::
            MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
            ::operator=((MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         *)&local_200,local_1a8);
            bVar10 = false;
          }
          else {
            lVar13 = iDynTree::MatrixDynSize::data();
            iDynTree::MatrixDynSize::rows();
            iDynTree::MatrixDynSize::cols();
            uVar16 = iDynTree::MatrixDynSize::data();
            lVar14 = iDynTree::MatrixDynSize::rows();
            lVar22 = iDynTree::MatrixDynSize::cols();
            uVar17 = lVar22 * lVar14;
            uVar15 = uVar17;
            if (((uVar16 & 7) == 0) &&
               (uVar15 = (ulong)((uint)(uVar16 >> 3) & 1), (long)uVar17 <= (long)uVar15)) {
              uVar15 = uVar17;
            }
            if (0 < (long)uVar15) {
              uVar24 = 0;
              do {
                *(double *)(uVar16 + uVar24 * 8) =
                     *(double *)(lVar13 + uVar24 * 8) + *(double *)(uVar16 + uVar24 * 8);
                uVar24 = uVar24 + 1;
              } while (uVar15 != uVar24);
            }
            lVar22 = uVar17 - uVar15;
            lVar14 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar15;
            if (1 < lVar22) {
              do {
                pdVar3 = (double *)(lVar13 + uVar15 * 8);
                dVar8 = pdVar3[1];
                pdVar4 = (double *)(uVar16 + uVar15 * 8);
                dVar6 = pdVar4[1];
                pdVar5 = (double *)(uVar16 + uVar15 * 8);
                *pdVar5 = *pdVar3 + *pdVar4;
                pdVar5[1] = dVar8 + dVar6;
                uVar15 = uVar15 + 2;
              } while ((long)uVar15 < lVar14);
            }
            if (lVar14 < (long)uVar17) {
              do {
                *(double *)(uVar16 + lVar14 * 8) =
                     *(double *)(lVar13 + lVar14 * 8) + *(double *)(uVar16 + lVar14 * 8);
                lVar14 = lVar14 + 1;
              } while (uVar17 - lVar14 != 0);
            }
          }
          control = local_1e0;
          uVar12 = ConstraintsGroup::constraintsDimension
                             ((ConstraintsGroup *)**(undefined8 **)(p_Var23 + 2));
          local_1c8 = local_1c8 + (ulong)uVar12;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating constraint ",0x22);
          ConstraintsGroup::name_abi_cxx11_
                    (&local_200,(ConstraintsGroup *)**(undefined8 **)(p_Var23 + 2));
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                               local_200._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,".",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","constraintSecondPartialDerivativeWRTStateControl",
                     local_200._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        if (!bVar11) {
          return local_205;
        }
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        local_205 = p_Var23 == local_1b8;
      } while (!local_205);
    }
  }
  return local_205;
}

Assistant:

bool OptimalControlProblem::constraintsSecondPartialDerivativeWRTStateControl(double time, const VectorDynSize &state, const VectorDynSize &control, const VectorDynSize &lambda, MatrixDynSize &hessian)
        {
            if ((hessian.rows() != state.size()) || (hessian.cols() != control.size())) {
                hessian.resize(state.size(), control.size());
            }

            if (m_pimpl->constraintsGroups.size() == 0) {
                hessian.zero();
                return true;
            }

            bool first = true;
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                toEigen(group.second->lambdaBuffer) = toEigen(lambda).segment(offset, group.second->group_ptr->constraintsDimension());

                if (! group.second->group_ptr->constraintSecondPartialDerivativeWRTStateControl(time, state, control, group.second->lambdaBuffer, group.second->mixedHessianBuffer)){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                    return false;
                }
                if (first){
                    toEigen(hessian) = toEigen(group.second->mixedHessianBuffer);
                    first = false;
                } else {
                    toEigen(hessian) += toEigen(group.second->mixedHessianBuffer);
                }
                offset += group.second->group_ptr->constraintsDimension();
            }
            return true;
        }